

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplace_back<slang::ast::Scope_const&,slang::syntax::TypeParameterDeclarationSyntax_const&,slang::syntax::TypeAssignmentSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,Scope *args,
          TypeParameterDeclarationSyntax *args_1,TypeAssignmentSyntax *args_2,bool *args_3,
          bool *args_4,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *args_5)

{
  size_type sVar1;
  reference pPVar2;
  
  if (this->len == this->cap) {
    pPVar2 = emplaceRealloc<slang::ast::Scope_const&,slang::syntax::TypeParameterDeclarationSyntax_const&,slang::syntax::TypeAssignmentSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
                       (this,this->data_ + this->len,args,args_1,args_2,args_3,args_4,args_5);
  }
  else {
    ast::DefinitionSymbol::ParameterDecl::ParameterDecl
              (this->data_ + this->len,args,args_1,args_2,*args_3,*args_4,*args_5);
    sVar1 = this->len;
    this->len = sVar1 + 1;
    pPVar2 = this->data_ + sVar1;
  }
  return pPVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }